

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_database.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalCopyDatabase::GetData
          (PhysicalCopyDatabase *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  byte bVar1;
  ClientContext *pCVar2;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *puVar3;
  size_type sVar4;
  undefined8 this_00;
  pointer pCVar5;
  pointer pCVar6;
  Binder *info;
  type info_00;
  CreateFunctionInfo *info_01;
  CreateSequenceInfo *info_02;
  CreateTypeInfo *info_03;
  CreateViewInfo *info_04;
  CreateIndexInfo *info_05;
  DataTable *this_01;
  TableIOManager *args_2;
  AttachedDatabase *args_3;
  shared_ptr<duckdb::DataTableInfo,_true> *this_02;
  type table_info;
  NotImplementedException *this_03;
  CatalogType type;
  pointer *__ptr;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *this_04;
  _Hash_node_base *p_Var7;
  unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true> *this_05
  ;
  _Hash_node_base *this_06;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  shared_ptr<duckdb::Binder,_true> binder;
  undefined1 local_128 [56];
  undefined1 local_f0 [40];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c8;
  vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_> local_90;
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  vStack_78;
  pointer local_60;
  __node_base local_58;
  string local_50;
  
  pCVar2 = context->client;
  this_05 = &this->info;
  pCVar5 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->(this_05);
  local_128._8_8_ = Catalog::GetCatalog(pCVar2,&pCVar5->target_database);
  pCVar5 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
           ::operator->(this_05);
  this_04 = (pCVar5->entries).
            super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pCVar5->entries).
           super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_04 == puVar3) {
      pCVar5 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
               ::operator->(this_05);
      this_06 = (_Hash_node_base *)
                (pCVar5->entries).
                super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var7 = (_Hash_node_base *)
               (pCVar5->entries).
               super_vector<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_06 != p_Var7) {
        local_128._40_8_ = p_Var7;
        local_128._48_8_ = context;
        do {
          if (((((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_> *)
                &this_06->_M_nxt)->_M_t).
               super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
               .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl != (CreateInfo *)0x0
              ) && (pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                             ::operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                                           *)this_06), (pCVar6->super_ParseInfo).field_0x9 == '\x04'
                   )) {
            pCVar2 = context->client;
            info_05 = (CreateIndexInfo *)
                      unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                      ::operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                                    *)this_06);
            this_00 = local_128._8_8_;
            Catalog::CreateIndex((Catalog *)local_128._8_8_,pCVar2,info_05);
            pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                     operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                                 *)this_06);
            local_f0._0_8_ =
                 Catalog::GetEntry<duckdb::TableCatalogEntry>
                           ((Catalog *)this_00,context->client,&pCVar6->schema,
                            (string *)(pCVar6 + 1),THROW_EXCEPTION,
                            (QueryErrorContext)0xffffffffffffffff);
            optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
                      ((optional_ptr<duckdb::TableCatalogEntry,_true> *)local_f0);
            this_01 = (DataTable *)(**(code **)(*(long *)local_f0._0_8_ + 0x80))();
            sVar4 = pCVar6[1].catalog.field_2._M_allocated_capacity;
            local_f0._0_8_ = (element_type *)(local_f0 + 0x10);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f0,sVar4,
                       *(long *)((long)&pCVar6[1].catalog.field_2 + 8) + sVar4);
            local_c8._M_buckets = &local_c8._M_single_bucket;
            local_c8._M_bucket_count = 1;
            local_c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_c8._M_element_count = 0;
            local_c8._M_rehash_policy._M_max_load_factor = 1.0;
            vStack_78.
            super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_78.
            super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_90.
            super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_78.
            super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_90.
            super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_90.
            super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c8._M_rehash_policy._M_next_resize = 0;
            local_c8._M_single_bucket = (__node_base_ptr)0x0;
            local_60 = (pointer)0xffffffffffffffff;
            local_58._M_nxt = (_Hash_node_base *)0x0;
            local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<char_const(&)[15],bool>
                      (&local_c8,
                       (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)"v1_0_0_storage",local_128);
            (*(pCVar6->super_ParseInfo)._vptr_ParseInfo[3])(local_128 + 0x20,pCVar6);
            args_2 = DataTable::GetTableIOManager(this_01);
            context = (ExecutionContext *)local_128._48_8_;
            args_3 = Catalog::GetAttached((Catalog *)local_128._8_8_);
            make_uniq<duckdb::UnboundIndex,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::IndexStorageInfo&,duckdb::TableIOManager&,duckdb::AttachedDatabase&>
                      ((duckdb *)local_128,
                       (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                        *)(local_128 + 0x20),(IndexStorageInfo *)local_f0,args_2,args_3);
            if ((long *)local_128._32_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_128._32_8_ + 8))();
            }
            local_128._16_8_ = local_128._0_8_;
            local_128._0_8_ =
                 (__uniq_ptr_data<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true,_true>
                  )0x0;
            DataTable::AddIndex(this_01,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                         *)(local_128 + 0x10));
            if ((element_type *)local_128._16_8_ != (element_type *)0x0) {
              (**(code **)((long)(((enable_shared_from_this<duckdb::Binder> *)local_128._16_8_)->
                                 __weak_this_).internal.
                                 super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          + 8))();
            }
            local_128._16_8_ = (ClientContext *)0x0;
            this_02 = DataTable::GetDataTableInfo(this_01);
            table_info = shared_ptr<duckdb::DataTableInfo,_true>::operator*(this_02);
            TableIndexList::InitializeIndexes
                      (&table_info->indexes,*&context->client,table_info,(char *)0x0);
            p_Var7 = (_Hash_node_base *)local_128._40_8_;
            if ((BoundCreateTableInfo *)local_128._0_8_ != (BoundCreateTableInfo *)0x0) {
              ::std::default_delete<duckdb::UnboundIndex>::operator()
                        ((default_delete<duckdb::UnboundIndex> *)local_128,
                         (UnboundIndex *)local_128._0_8_);
            }
            ::std::
            vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
            ::~vector(&vStack_78);
            ::std::
            vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
            ::~vector(&local_90);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_c8);
            if ((element_type *)local_f0._0_8_ != (element_type *)(local_f0 + 0x10)) {
              operator_delete((void *)local_f0._0_8_);
            }
          }
          this_06 = this_06 + 1;
        } while (this_06 != p_Var7);
      }
      return FINISHED;
    }
    pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->(this_04);
    bVar1 = (pCVar6->super_ParseInfo).field_0x9;
    switch(bVar1) {
    case 1:
      Binder::CreateBinder
                ((Binder *)local_f0,context->client,(optional_ptr<duckdb::Binder,_true>)0x0,
                 REGULAR_BINDER);
      info = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_f0);
      local_128._24_8_ =
           (this_04->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
           super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
      (this_04->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
      .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
      Binder::BindCreateTableInfo
                ((Binder *)local_128,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 info);
      if ((CreateInfo *)local_128._24_8_ != (CreateInfo *)0x0) {
        (**(code **)((long)((ParseInfo *)local_128._24_8_)->_vptr_ParseInfo + 8))();
      }
      local_128._24_8_ = (__buckets_ptr)0x0;
      pCVar2 = context->client;
      info_00 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                             *)local_128);
      Catalog::CreateTable((Catalog *)local_128._8_8_,pCVar2,info_00);
      if ((element_type *)local_128._0_8_ != (element_type *)0x0) {
        ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                  ((default_delete<duckdb::BoundCreateTableInfo> *)local_128,
                   (BoundCreateTableInfo *)local_128._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
      }
      break;
    case 2:
      pCVar2 = context->client;
      pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->(this_04);
      Catalog::CreateSchema((Catalog *)local_128._8_8_,pCVar2,(CreateSchemaInfo *)pCVar6);
      break;
    case 3:
      pCVar2 = context->client;
      info_04 = (CreateViewInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(this_04);
      Catalog::CreateView((Catalog *)local_128._8_8_,pCVar2,info_04);
      break;
    case 4:
      break;
    case 5:
    case 7:
switchD_016eb319_caseD_5:
      this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_f0._0_8_ = local_f0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"Entry type %s not supported in PhysicalCopyDatabase","");
      pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->(this_04);
      CatalogTypeToString_abi_cxx11_
                (&local_50,(duckdb *)(ulong)(byte)(pCVar6->super_ParseInfo).field_0x9,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_03,(string *)local_f0,&local_50);
      __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case 6:
      pCVar2 = context->client;
      info_02 = (CreateSequenceInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(this_04);
      Catalog::CreateSequence((Catalog *)local_128._8_8_,pCVar2,info_02);
      break;
    case 8:
      pCVar2 = context->client;
      info_03 = (CreateTypeInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(this_04);
      Catalog::CreateType((Catalog *)local_128._8_8_,pCVar2,info_03);
      break;
    default:
      if (1 < bVar1 - 0x1e) goto switchD_016eb319_caseD_5;
      pCVar2 = context->client;
      info_01 = (CreateFunctionInfo *)
                unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(this_04);
      Catalog::CreateFunction((Catalog *)local_128._8_8_,pCVar2,info_01);
    }
    this_04 = this_04 + 1;
  } while( true );
}

Assistant:

SourceResultType PhysicalCopyDatabase::GetData(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSourceInput &input) const {
	auto &catalog = Catalog::GetCatalog(context.client, info->target_database);
	for (auto &create_info : info->entries) {
		switch (create_info->type) {
		case CatalogType::SCHEMA_ENTRY:
			catalog.CreateSchema(context.client, create_info->Cast<CreateSchemaInfo>());
			break;
		case CatalogType::VIEW_ENTRY:
			catalog.CreateView(context.client, create_info->Cast<CreateViewInfo>());
			break;
		case CatalogType::SEQUENCE_ENTRY:
			catalog.CreateSequence(context.client, create_info->Cast<CreateSequenceInfo>());
			break;
		case CatalogType::TYPE_ENTRY:
			catalog.CreateType(context.client, create_info->Cast<CreateTypeInfo>());
			break;
		case CatalogType::MACRO_ENTRY:
		case CatalogType::TABLE_MACRO_ENTRY:
			catalog.CreateFunction(context.client, create_info->Cast<CreateMacroInfo>());
			break;
		case CatalogType::TABLE_ENTRY: {
			auto binder = Binder::CreateBinder(context.client);
			auto bound_info = binder->BindCreateTableInfo(std::move(create_info));
			catalog.CreateTable(context.client, *bound_info);
			break;
		}
		case CatalogType::INDEX_ENTRY: {
			// Skip for now.
			break;
		}
		default:
			throw NotImplementedException("Entry type %s not supported in PhysicalCopyDatabase",
			                              CatalogTypeToString(create_info->type));
		}
	}

	// Create the indexes after table creation.
	for (auto &create_info : info->entries) {
		if (!create_info || create_info->type != CatalogType::INDEX_ENTRY) {
			continue;
		}
		catalog.CreateIndex(context.client, create_info->Cast<CreateIndexInfo>());

		auto &create_index_info = create_info->Cast<CreateIndexInfo>();
		auto &table_entry =
		    catalog.GetEntry<TableCatalogEntry>(context.client, create_index_info.schema, create_index_info.table);
		auto &data_table = table_entry.GetStorage();

		IndexStorageInfo storage_info(create_index_info.index_name);
		storage_info.options.emplace("v1_0_0_storage", false);
		auto unbound_index = make_uniq<UnboundIndex>(create_index_info.Copy(), storage_info,
		                                             data_table.GetTableIOManager(), catalog.GetAttached());

		data_table.AddIndex(std::move(unbound_index));
		auto &data_table_info = *data_table.GetDataTableInfo();
		data_table_info.GetIndexes().InitializeIndexes(context.client, data_table_info);
	}

	return SourceResultType::FINISHED;
}